

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)15>_> * __thiscall
vkt::synchronization::PipelineCacheData::createPipelineCache
          (Move<vk::Handle<(vk::HandleType)15>_> *__return_storage_ptr__,PipelineCacheData *this,
          DeviceInterface *vk,VkDevice device)

{
  VkPipelineCacheCreateInfo params;
  VkPipelineCacheCreateInfo local_48;
  
  de::Mutex::lock(&this->m_lock);
  local_48.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.flags = 0;
  local_48.pInitialData =
       (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.initialDataSize =
       (long)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)local_48.pInitialData;
  if (local_48.initialDataSize == 0) {
    local_48.pInitialData = (pointer)0x0;
  }
  ::vk::createPipelineCache(__return_storage_ptr__,vk,device,&local_48,(VkAllocationCallbacks *)0x0)
  ;
  de::Mutex::unlock(&this->m_lock);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<VkPipelineCache> PipelineCacheData::createPipelineCache (const vk::DeviceInterface& vk, const vk::VkDevice device) const
{
	const de::ScopedLock						dataLock	(m_lock);
	const struct vk::VkPipelineCacheCreateInfo	params	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,
		DE_NULL,
		(vk::VkPipelineCacheCreateFlags)0,
		(deUintptr)m_data.size(),
		(m_data.empty() ? DE_NULL : &m_data[0])
	};

	return vk::createPipelineCache(vk, device, &params);
}